

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::TypedArrayBase::GetPropertyQuery
          (TypedArrayBase *this,Var originalInstance,JavascriptString *propertyNameString,Var *value
          ,PropertyValueInfo *info,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  charcount_t length;
  BOOL BVar3;
  char16 *str;
  undefined4 *puVar4;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar5;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *value_local;
  JavascriptString *propertyNameString_local;
  Var originalInstance_local;
  TypedArrayBase *this_local;
  
  str = JavascriptString::GetString(propertyNameString);
  length = JavascriptString::GetLength(propertyNameString);
  bVar2 = PropertyRecord::IsPropertyNameNumeric(str,length);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x221,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord*"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  BVar3 = CanonicalNumericIndexString(propertyNameString,requestContext);
  if (BVar3 == 0) {
    this_local._4_4_ =
         DynamicObject::GetPropertyQuery
                   ((DynamicObject *)this,originalInstance,propertyNameString,value,info,
                    requestContext);
  }
  else {
    this_00 = ScriptContext::GetLibrary(requestContext);
    pRVar5 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
    *value = pRVar5;
    this_local._4_4_ = Property_NotFound_NoProto;
  }
  return this_local._4_4_;
}

Assistant:

PropertyQueryFlags TypedArrayBase::GetPropertyQuery(Var originalInstance, JavascriptString* propertyNameString, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord*");

        if (CanonicalNumericIndexString(propertyNameString, requestContext))
        {
            *value = requestContext->GetLibrary()->GetUndefined();
            return PropertyQueryFlags::Property_NotFound_NoProto;
        }

        return DynamicObject::GetPropertyQuery(originalInstance, propertyNameString, value, info, requestContext);
    }